

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsMassSetup(ARKodeMem ark_mem,sunrealtype t,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = (int *)(*ark_mem->step_getmassmem)(ark_mem);
  if (piVar2 == (int *)0x0) {
    arkProcessError(ark_mem,-6,0x101d,"arkLsMassSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"Mass matrix solver memory is NULL.");
    return -6;
  }
  iVar1 = SUNLinSolGetType(*(undefined8 *)(piVar2 + 0x24));
  if ((iVar1 == 3) || (ABS(*(double *)(piVar2 + 0x10) - t) < ark_mem->uround * 100.0)) {
LAB_00143dcf:
    piVar2[0x38] = 0;
    return 0;
  }
  if ((*(code **)(piVar2 + 0x32) != (code *)0x0) &&
     ((piVar2[0xe] != 0 || (*(long *)(piVar2 + 0x16) == 0)))) {
    iVar1 = (**(code **)(piVar2 + 0x32))(t,*(undefined8 *)(piVar2 + 0x36));
    piVar2[0x38] = iVar1;
    *(long *)(piVar2 + 0x16) = *(long *)(piVar2 + 0x16) + 1;
    *(sunrealtype *)(piVar2 + 0x10) = t;
    if (iVar1 != 0) {
      arkProcessError(ark_mem,iVar1,0xe6a,"arkLsMassSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"The mass matrix x vector setup routine failed in an unrecoverable manner.");
      goto LAB_00143f0e;
    }
  }
  lVar3 = *(long *)(piVar2 + 4);
  if (lVar3 == 0) {
    if (*(long *)(piVar2 + 0x2a) == 0) {
LAB_00143f0e:
      return piVar2[0x38];
    }
  }
  else {
    if ((piVar2[0xe] == 0) && (0 < *(long *)(piVar2 + 0x12))) goto LAB_00143dcf;
    if (*piVar2 == 0) {
      iVar1 = SUNMatZero();
      if (iVar1 != 0) {
        iVar1 = 0xe8a;
        goto LAB_00143f5d;
      }
      lVar3 = *(long *)(piVar2 + 4);
    }
    iVar1 = (**(code **)(piVar2 + 2))(t,lVar3,*(undefined8 *)(piVar2 + 8),vtemp1,vtemp2,vtemp3);
    *(sunrealtype *)(piVar2 + 0x10) = t;
    if (iVar1 < 0) {
      arkProcessError(ark_mem,-9,0xe97,"arkLsMassSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"The mass matrix routine failed in an unrecoverable manner.");
      piVar2[0x38] = -9;
      return -1;
    }
    if (iVar1 != 0) {
      piVar2[0x38] = -10;
      return 1;
    }
    if ((*piVar2 == 0) &&
       (iVar1 = SUNMatCopy(*(undefined8 *)(piVar2 + 4),*(undefined8 *)(piVar2 + 6)), iVar1 != 0)) {
      iVar1 = 0xea8;
LAB_00143f5d:
      arkProcessError(ark_mem,-0xb,iVar1,"arkLsMassSetup",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"A SUNMatrix routine failed in an unrecoverable manner.");
      piVar2[0x38] = -0xb;
      return -0xb;
    }
    if ((*(long *)(piVar2 + 0x34) == 0) &&
       (*(long *)(*(long *)(*(long *)(piVar2 + 4) + 8) + 0x38) != 0)) {
      iVar1 = SUNMatMatvecSetup();
      *(long *)(piVar2 + 0x1a) = *(long *)(piVar2 + 0x1a) + 1;
      if (iVar1 != 0) {
        iVar1 = 0xec2;
        goto LAB_00143f5d;
      }
    }
  }
  iVar1 = SUNLinSolSetup(*(undefined8 *)(piVar2 + 0x24),*(undefined8 *)(piVar2 + 6));
  piVar2[0x38] = iVar1;
  *(long *)(piVar2 + 0x12) = *(long *)(piVar2 + 0x12) + 1;
  return iVar1;
}

Assistant:

int arkLsMassSetup(ARKodeMem ark_mem, sunrealtype t, N_Vector vtemp1,
                   N_Vector vtemp2, N_Vector vtemp3)
{
  ARKLsMassMem arkls_mem;
  sunbooleantype call_mtsetup, call_mvsetup, call_lssetup;
  int retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* if the most recent setup essentially matches the current time,
     just return with success */
  if (SUNRabs(arkls_mem->msetuptime - t) < FUZZ_FACTOR * ark_mem->uround)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* Determine whether to call user-provided mtsetup routine */
  call_mtsetup = SUNFALSE;
  if ((arkls_mem->mtsetup) &&
      (arkls_mem->time_dependent || (arkls_mem->nmtsetup == 0)))
  {
    call_mtsetup = SUNTRUE;
  }

  /* call user-provided mtsetup routine if applicable */
  if (call_mtsetup)
  {
    arkls_mem->last_flag = arkls_mem->mtsetup(t, arkls_mem->mt_data);
    arkls_mem->nmtsetup++;
    arkls_mem->msetuptime = t;
    if (arkls_mem->last_flag != 0)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, MSG_LS_MTSETUP_FAILED);
      return (arkls_mem->last_flag);
    }
  }

  /* Perform user-facing setup based on whether this is matrix-free */
  if (arkls_mem->M == NULL)
  {
    /*** matrix-free -- only call LS setup if preconditioner setup exists ***/
    call_lssetup = (arkls_mem->pset != NULL);
    /*** matrix-free -- dont call matvec setup ***/
    call_mvsetup = SUNFALSE;
  }
  else
  {
    /*** matrix-based ***/

    /* If mass matrix is not time dependent, and if it has been set up
       previously, then just reuse existing matrix and factorization */
    if (!arkls_mem->time_dependent && (arkls_mem->nmsetups > 0))
    {
      arkls_mem->last_flag = ARKLS_SUCCESS;
      return (arkls_mem->last_flag);
    }

    /* Clear the mass matrix if necessary (direct linear solvers) */
    if (!(arkls_mem->iterative))
    {
      retval = SUNMatZero(arkls_mem->M);
      if (retval)
      {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return (arkls_mem->last_flag);
      }
    }

    /* Call user-supplied routine to fill the mass matrix */
    retval = arkls_mem->mass(t, arkls_mem->M, arkls_mem->M_data, vtemp1, vtemp2,
                             vtemp3);
    arkls_mem->msetuptime = t;
    if (retval < 0)
    {
      arkProcessError(ark_mem, ARKLS_MASSFUNC_UNRECVR, __LINE__, __func__,
                      __FILE__, MSG_LS_MASSFUNC_FAILED);
      arkls_mem->last_flag = ARKLS_MASSFUNC_UNRECVR;
      return (-1);
    }
    if (retval > 0)
    {
      arkls_mem->last_flag = ARKLS_MASSFUNC_RECVR;
      return (1);
    }

    /* Copy M into M_lu for factorization (direct linear solvers) */
    if (!(arkls_mem->iterative))
    {
      retval = SUNMatCopy(arkls_mem->M, arkls_mem->M_lu);
      if (retval)
      {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return (arkls_mem->last_flag);
      }
    }

    /* signal call to matvec setup routine only if the user didn't provide
       mtimes and the SUNMatrix implements the matvecsetup routine */
    if ((!arkls_mem->mtimes) && (arkls_mem->M->ops->matvecsetup))
    {
      call_mvsetup = SUNTRUE;
    }
    else { call_mvsetup = SUNFALSE; }

    /* signal call to LS setup routine */
    call_lssetup = SUNTRUE;
  }

  /* Call matvec setup routine if applicable */
  if (call_mvsetup)
  {
    retval = SUNMatMatvecSetup(arkls_mem->M);
    arkls_mem->nmvsetup++;
    if (retval)
    {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_LS_SUNMAT_FAILED);
      arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
      return (arkls_mem->last_flag);
    }
  }

  /* Call LS setup routine if applicable, and return */
  if (call_lssetup)
  {
    arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS, arkls_mem->M_lu);
    arkls_mem->nmsetups++;
  }

  return (arkls_mem->last_flag);
}